

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_buffer_allocator.c
# Opt level: O0

void ion_buffer_release(aura_node *node,void *data,aura_buffer *buf)

{
  uint uVar1;
  list_head **__ptr;
  int ret;
  aura_buffer *__mptr;
  aura_ion_buffer_descriptor *dsc;
  aura_ion_allocator_data *pv;
  aura_buffer *buf_local;
  void *data_local;
  aura_node *node_local;
  
  __ptr = &buf[-1].qentry.prev;
  if (buf->data != (char *)0x0) {
    munmap(buf->data,(long)*(int *)&buf[-1].data);
    uVar1 = ion_free(*data,*(ion_user_handle_t *)((long)&buf[-1].data + 4));
    if (uVar1 != 0) {
      BUG(node,"Shit happened when doing ion_free(): %d",(ulong)uVar1);
    }
    close(*(int *)__ptr);
  }
  free(__ptr);
  return;
}

Assistant:

static void ion_buffer_release(struct aura_node *node, void *data, struct aura_buffer *buf)
{
	struct aura_ion_allocator_data *pv = data;
	struct aura_ion_buffer_descriptor *dsc = container_of(buf, struct aura_ion_buffer_descriptor, buf);
	int ret;

	if (dsc->buf.data) {
		munmap(dsc->buf.data, dsc->size);

		ret = ion_free(pv->ion_fd, dsc->hndl);
		if (ret)
			BUG(node, "Shit happened when doing ion_free(): %d", ret);

		close(dsc->map_fd);
	}
	free(dsc);
}